

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptRegExp::GetPropertyBuiltIns
          (JavascriptRegExp *this,PropertyId propertyId,Var *value,BOOL *result)

{
  uint32 nValue;
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  ScriptConfiguration *this_00;
  void **ppvVar4;
  undefined4 *puVar5;
  JavascriptLibrary *pJVar6;
  RegexPattern *pRVar7;
  JavascriptBoolean *pJVar8;
  JavascriptString *pJVar9;
  Var pvVar10;
  ScriptConfiguration *scriptConfig;
  BOOL *result_local;
  Var *value_local;
  PropertyId propertyId_local;
  JavascriptRegExp *this_local;
  
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_00 = ScriptContext::GetConfig(pSVar3);
  if (propertyId == 0x153) {
    bVar2 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pJVar9 = ToString(this,true);
      *value = pJVar9;
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else if (propertyId == 0x1a0) {
    bVar2 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar7 = GetPattern(this);
      bVar2 = UnifiedRegex::RegexPattern::IsGlobal(pRVar7);
      pJVar8 = JavascriptLibrary::CreateBoolean(pJVar6,(uint)bVar2);
      *value = pJVar8;
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else if (propertyId == 0x1a2) {
    ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->lastIndexVar);
    if (*ppvVar4 == (void *)0x0) {
      if (0x7ffffffe < this->lastIndexOrFlag) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                    ,0x4ae,"(lastIndexOrFlag <= MaxCharCount)",
                                    "lastIndexOrFlag <= MaxCharCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      nValue = this->lastIndexOrFlag;
      pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      pvVar10 = JavascriptNumber::ToVar(nValue,pSVar3);
      Memory::WriteBarrierPtr<void>::operator=(&this->lastIndexVar,pvVar10);
    }
    ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->lastIndexVar);
    *value = *ppvVar4;
    *result = 1;
    this_local._7_1_ = true;
  }
  else if (propertyId == 0x1a3) {
    bVar2 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar7 = GetPattern(this);
      bVar2 = UnifiedRegex::RegexPattern::IsMultiline(pRVar7);
      pJVar8 = JavascriptLibrary::CreateBoolean(pJVar6,(uint)bVar2);
      *value = pJVar8;
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else if (propertyId == 0x1a4) {
    bVar2 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar7 = GetPattern(this);
      bVar2 = UnifiedRegex::RegexPattern::IsDotAll(pRVar7);
      pJVar8 = JavascriptLibrary::CreateBoolean(pJVar6,(uint)bVar2);
      *value = pJVar8;
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else if (propertyId == 0x1a5) {
    bVar2 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar7 = GetPattern(this);
      bVar2 = UnifiedRegex::RegexPattern::IsIgnoreCase(pRVar7);
      pJVar8 = JavascriptLibrary::CreateBoolean(pJVar6,(uint)bVar2);
      *value = pJVar8;
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else if (propertyId == 0x1a6) {
    bVar2 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar7 = GetPattern(this);
      bVar2 = UnifiedRegex::RegexPattern::IsUnicode(pRVar7);
      pJVar8 = JavascriptLibrary::CreateBoolean(pJVar6,(uint)bVar2);
      *value = pJVar8;
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else if (propertyId == 0x1a7) {
    bVar2 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar7 = GetPattern(this);
      bVar2 = UnifiedRegex::RegexPattern::IsSticky(pRVar7);
      pJVar8 = JavascriptLibrary::CreateBoolean(pJVar6,(uint)bVar2);
      *value = pJVar8;
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else if (propertyId == 0x1e0) {
    bVar2 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      pvVar10 = GetOptions(this);
      *value = pvVar10;
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool JavascriptRegExp::GetPropertyBuiltIns(PropertyId propertyId, Var* value, BOOL* result)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define GET_FLAG(patternMethod) \
        if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled()) \
        { \
            *value = this->GetLibrary()->CreateBoolean(this->GetPattern()->##patternMethod##()); \
            *result = true; \
            return true; \
        } \
        else \
        { \
            return false; \
        }

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            if (this->lastIndexVar == nullptr)
            {
                Assert(lastIndexOrFlag <= MaxCharCount);
                this->lastIndexVar = JavascriptNumber::ToVar(lastIndexOrFlag, GetScriptContext());
            }
            *value = this->lastIndexVar;
            *result = true;
            return true;
        case PropertyIds::global:
            GET_FLAG(IsGlobal)
        case PropertyIds::multiline:
            GET_FLAG(IsMultiline)
        case PropertyIds::dotAll:
            GET_FLAG(IsDotAll)
        case PropertyIds::ignoreCase:
            GET_FLAG(IsIgnoreCase)
        case PropertyIds::unicode:
            GET_FLAG(IsUnicode)
        case PropertyIds::sticky:
            GET_FLAG(IsSticky)
        case PropertyIds::source:
            if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled())
            {
                *value = this->ToString(true);
                *result = true;
                return true;
            }
            else
            {
                return false;
            }
        case PropertyIds::options:
            if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled())
            {
                *value = GetOptions();
                *result = true;
                return true;
            }
            else
            {
                return false;
            }
        default:
            return false;
        }

#undef GET_FLAG
    }